

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::finishSendingError(Connection *this,Promise<void> *promise)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  PromiseAwaiter<void> *pPVar1;
  HttpOutputStream *this_01;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> coroutine;
  undefined8 *in_RDX;
  
  coroutine._M_fr_ptr = operator_new(0x5c8);
  *(code **)coroutine._M_fr_ptr = finishSendingError;
  *(code **)((long)coroutine._M_fr_ptr + 8) = finishSendingError;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x10);
  *(Promise<void> **)((long)coroutine._M_fr_ptr + 0x5b8) = promise;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5a8) = *in_RDX;
  *in_RDX = 0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706898;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007068e0;
  location.function = "finishSendingError";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1f6e;
  location.columnNumber = 0x1b;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706898;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007068e0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  co_await<void>(pPVar1,(Promise<void> *)((long)coroutine._M_fr_ptr + 0x5a8));
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c4) = 0;
  bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
  if (!bVar2) {
    kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
    if (*(char *)(*(long *)((long)coroutine._M_fr_ptr + 0x5b8) + 0x141) == '\0') {
      this_01 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0x5b0);
      anon_unknown_36::HttpOutputStream::flush(this_01);
      pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
      co_await<void>(pPVar1,(Promise<void> *)this_01);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c4) = 1;
      bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
      if (bVar2) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
      node = (PromiseArenaMember *)
             (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
             currentWrapper.ptr;
      if (node != (PromiseArenaMember *)0x0) {
        (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
        currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
    }
    *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x5c0) =
         BREAK_LOOP_CONN_ERR;
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
              (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                       ((long)coroutine._M_fr_ptr + 0x5c0));
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c4) = 2;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> finishSendingError(kj::Promise<void> promise) {
    co_await promise;
    if (!httpOutput.isBroken()) {
      // Skip flush for broken streams, since it will throw an exception that may be worse than
      // the one we just handled.
      co_await httpOutput.flush();
    }
    co_return BREAK_LOOP_CONN_ERR;
  }